

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O1

type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type word)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  qsbr_epoch local_19;
  
  uVar5 = (uint)((word & 0x3fffffff3fffffff) >> 0x20);
  uVar2 = (uint)(word & 0x3fffffff3fffffff);
  if (uVar5 < uVar2) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  if (uVar5 == 0) {
    __assert_fail("old_thread_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x170,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  if (uVar2 != 1) {
    __assert_fail("get_threads_in_previous_epoch(word) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x171,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  bVar4 = (byte)(word >> 0x3e) + 1;
  local_19.epoch_val = bVar4 & 3;
  uVar3 = (ulong)(uVar5 - 1) << 0x20 | (ulong)bVar4 << 0x3e;
  bVar1 = detail::qsbr_epoch::operator==(&local_19,(qsbr_epoch)(epoch_type)(uVar3 >> 0x3e));
  if (bVar1) {
    return uVar3 | uVar5 - 1;
  }
  __assert_fail("get_epoch(word).advance() == get_epoch(result)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x17b,
                "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type
  inc_epoch_dec_thread_count_reset_previous(type word) noexcept {
    assert_invariants(word);
    const auto old_thread_count = get_thread_count(word);
    UNODB_DETAIL_ASSERT(old_thread_count > 0);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) == 1);

    const auto new_word_with_epoch = make_from_epoch(get_epoch(word).advance());
    const auto new_thread_count = old_thread_count - 1;
    const auto new_word_with_thread_count = static_cast<type>(new_thread_count)
                                            << thread_count_in_word_offset;
    const auto new_threads_in_previous = new_thread_count;
    const auto result = new_word_with_epoch | new_word_with_thread_count |
                        new_threads_in_previous;

    UNODB_DETAIL_ASSERT(get_epoch(word).advance() == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) - 1 == get_thread_count(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(result) ==
                        get_thread_count(result));
    assert_invariants(result);

    return result;
  }